

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuntimeThreadData.cpp
# Opt level: O0

DWORD __thiscall RuntimeThreadData::ThreadProc(RuntimeThreadData *this)

{
  bool bVar1;
  JsErrorCode JVar2;
  uint byteLength;
  RuntimeThreadLocalData *pRVar3;
  PAL_FILE *pPVar4;
  LPCWSTR pWVar5;
  void *data;
  size_t length;
  DWORD_PTR sourceContext;
  JsValueRef local_78;
  JsValueRef args [3];
  HANDLE pVStack_58;
  DWORD waitRet;
  HANDLE handles [2];
  JsErrorCode jsErrorCode_3;
  JsErrorCode jsErrorCode_2;
  JsErrorCode jsErrorCode_1;
  JsErrorCode jsErrorCode;
  HRESULT hr;
  char *fullPath;
  JsValueRef fname;
  JsValueRef scriptSource;
  RuntimeThreadData *this_local;
  
  scriptSource = this;
  pRVar3 = (RuntimeThreadLocalData *)_ZTW15threadLocalData();
  RuntimeThreadLocalData::Initialize(pRVar3,this);
  JVar2 = ChakraRTInterface::JsCreateRuntime
                    (JsRuntimeAttributeNone,(JsThreadServiceCallback)0x0,&this->runtime);
  if (JVar2 == JsNoError) {
    JVar2 = ChakraRTInterface::JsCreateContext(this->runtime,&this->context);
    if (JVar2 == JsNoError) {
      JVar2 = ChakraRTInterface::JsSetCurrentContext(this->context);
      if (JVar2 == JsNoError) {
        bVar1 = WScriptJsrt::Initialize();
        if (bVar1) {
          data = (void *)std::__cxx11::string::c_str();
          byteLength = std::__cxx11::string::size();
          handles[1]._4_4_ =
               ChakraRTInterface::JsCreateExternalArrayBuffer
                         (data,byteLength,(JsFinalizeCallback)0x0,(void *)0x0,&fname);
          if (handles[1]._4_4_ == JsNoError) {
            length = strlen("agent source");
            ChakraRTInterface::JsCreateString("agent source",length,&fullPath);
            sourceContext = WScriptJsrt::GetNextSourceContext();
            ChakraRTInterface::JsRun
                      (fname,sourceContext,fullPath,JsParseScriptAttributeNone,(JsValueRef *)0x0);
            SetEvent(this->parent->hevntInitialScriptCompleted);
            do {
              pVStack_58 = this->hevntReceivedBroadcast;
              handles[0] = this->hevntShutdown;
              args[2]._4_4_ = WaitForMultipleObjects(2,&stack0xffffffffffffffa8,0,0xffffffff);
              if (args[2]._4_4_ == 0) {
                ChakraRTInterface::JsGetGlobalObject(&local_78);
                ChakraRTInterface::JsCreateSharedArrayBufferWithSharedContent
                          (this->parent->sharedContent,args);
                ChakraRTInterface::JsDoubleToNumber(1.0,args + 1);
                ReleaseSemaphore(this->parent->hSemaphore,1,(LPLONG)0x0);
                if (this->receiveBroadcastCallbackFunc != (JsValueRef)0x0) {
                  ChakraRTInterface::JsCallFunction
                            (this->receiveBroadcastCallbackFunc,&local_78,3,(JsValueRef *)0x0);
                }
              }
              if ((args[2]._4_4_ == 1) || ((this->leaving & 1U) != 0)) {
                WScriptJsrt::Uninitialize();
                if (this->receiveBroadcastCallbackFunc != (JsValueRef)0x0) {
                  ChakraRTInterface::JsRelease(this->receiveBroadcastCallbackFunc,(uint *)0x0);
                }
                ChakraRTInterface::JsSetCurrentContext((JsContextRef)0x0);
                ChakraRTInterface::JsDisposeRuntime(this->runtime);
                pRVar3 = (RuntimeThreadLocalData *)_ZTW15threadLocalData();
                RuntimeThreadLocalData::Uninitialize(pRVar3);
                return 0;
              }
            } while (args[2]._4_4_ == 0);
            pPVar4 = PAL_get_stderr(0);
            PAL_fprintf(pPVar4,"ASSERTION (%s, line %d) %s %s\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/bin/ch/RuntimeThreadData.cpp"
                        ,0x76,"false");
            pPVar4 = PAL_get_stderr(0);
            PAL_fflush(pPVar4);
            DebugBreak();
          }
          else {
            pPVar4 = PAL_get_stderr(0);
            JVar2 = handles[1]._4_4_;
            pWVar5 = Helpers::JsErrorCodeToString(handles[1]._4_4_);
            PAL_fwprintf(pPVar4,
                         L"ERROR: ChakraRTInterface::JsCreateExternalArrayBuffer((void*)this->initialSource.c_str(), (unsigned int)this->initialSource.size(), nullptr, nullptr, &scriptSource) failed. JsErrorCode=0x%x (%s)\n"
                         ,(ulong)JVar2,pWVar5);
            pPVar4 = PAL_get_stderr(0);
            PAL_fflush(pPVar4);
          }
        }
      }
      else {
        pPVar4 = PAL_get_stderr(0);
        pWVar5 = Helpers::JsErrorCodeToString(JVar2);
        PAL_fwprintf(pPVar4,
                     L"ERROR: ChakraRTInterface::JsSetCurrentContext(context) failed. JsErrorCode=0x%x (%s)\n"
                     ,(ulong)JVar2,pWVar5);
        pPVar4 = PAL_get_stderr(0);
        PAL_fflush(pPVar4);
      }
    }
    else {
      pPVar4 = PAL_get_stderr(0);
      pWVar5 = Helpers::JsErrorCodeToString(JVar2);
      PAL_fwprintf(pPVar4,
                   L"ERROR: ChakraRTInterface::JsCreateContext(runtime, &context) failed. JsErrorCode=0x%x (%s)\n"
                   ,(ulong)JVar2,pWVar5);
      pPVar4 = PAL_get_stderr(0);
      PAL_fflush(pPVar4);
    }
  }
  else {
    pPVar4 = PAL_get_stderr(0);
    pWVar5 = Helpers::JsErrorCodeToString(JVar2);
    PAL_fwprintf(pPVar4,
                 L"ERROR: ChakraRTInterface::JsCreateRuntime(JsRuntimeAttributeNone, nullptr, &runtime) failed. JsErrorCode=0x%x (%s)\n"
                 ,(ulong)JVar2,pWVar5);
    pPVar4 = PAL_get_stderr(0);
    PAL_fflush(pPVar4);
  }
  ChakraRTInterface::JsSetCurrentContext((JsContextRef)0x0);
  ChakraRTInterface::JsDisposeRuntime(this->runtime);
  pRVar3 = (RuntimeThreadLocalData *)_ZTW15threadLocalData();
  RuntimeThreadLocalData::Uninitialize(pRVar3);
  return 0;
}

Assistant:

DWORD RuntimeThreadData::ThreadProc()
{
    JsValueRef scriptSource;
    JsValueRef fname;
    const char* fullPath = "agent source";
    HRESULT hr = S_OK;

    threadLocalData.Initialize(this);

    IfJsErrorFailLog(ChakraRTInterface::JsCreateRuntime(JsRuntimeAttributeNone, nullptr, &runtime));
    IfJsErrorFailLog(ChakraRTInterface::JsCreateContext(runtime, &context));
    IfJsErrorFailLog(ChakraRTInterface::JsSetCurrentContext(context));


    if (!WScriptJsrt::Initialize())
    {
        IfFailGo(E_FAIL);
    }


    IfJsErrorFailLog(ChakraRTInterface::JsCreateExternalArrayBuffer((void*)this->initialSource.c_str(),
        (unsigned int)this->initialSource.size(), nullptr, nullptr, &scriptSource));


    ChakraRTInterface::JsCreateString(fullPath, strlen(fullPath), &fname);

    ChakraRTInterface::JsRun(scriptSource, WScriptJsrt::GetNextSourceContext(), fname, JsParseScriptAttributeNone, nullptr);

    SetEvent(this->parent->hevntInitialScriptCompleted);

    // loop waiting for work;

    while (true)
    {
        HANDLE handles[] = { this->hevntReceivedBroadcast, this->hevntShutdown };
        DWORD waitRet = WaitForMultipleObjects(_countof(handles), handles, false, INFINITE);

        if (waitRet == WAIT_OBJECT_0)
        {
            JsValueRef args[3];
            ChakraRTInterface::JsGetGlobalObject(&args[0]);
            ChakraRTInterface::JsCreateSharedArrayBufferWithSharedContent(this->parent->sharedContent, &args[1]);
            ChakraRTInterface::JsDoubleToNumber(1, &args[2]);

            // notify the parent we received the data
            ReleaseSemaphore(this->parent->hSemaphore, 1, NULL);

            if (this->receiveBroadcastCallbackFunc)
            {
                ChakraRTInterface::JsCallFunction(this->receiveBroadcastCallbackFunc, args, 3, nullptr);
            }
        }

        if (waitRet == WAIT_OBJECT_0 + 1 || this->leaving)
        {
            WScriptJsrt::Uninitialize();

            if (this->receiveBroadcastCallbackFunc)
            {
                ChakraRTInterface::JsRelease(this->receiveBroadcastCallbackFunc, nullptr);
            }
            ChakraRTInterface::JsSetCurrentContext(nullptr);
            ChakraRTInterface::JsDisposeRuntime(runtime);

            threadLocalData.Uninitialize();
            return 0;
        }
        else if (waitRet != WAIT_OBJECT_0)
        {
            Assert(false);
            break;
        }
    }

Error:

    ChakraRTInterface::JsSetCurrentContext(nullptr);
    ChakraRTInterface::JsDisposeRuntime(runtime);
    threadLocalData.Uninitialize();
    return 0;
}